

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerResults.cpp
# Opt level: O2

void __thiscall
AsyncRgbLedAnalyzerResults::GenerateBubbleText
          (AsyncRgbLedAnalyzerResults *this,U64 frame_index,Channel *channel,
          DisplayBase display_base)

{
  U8 bitSize;
  U8 webColor [3];
  RGBValue rgb;
  char webBuf [8];
  char greenString [16];
  char redString [16];
  Frame frame;
  U64 local_150;
  char blueString [16];
  char buf [256];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)&frame);
  rgb = RGBValue::CreateFromU64(local_150);
  bitSize = AsyncRgbLedAnalyzerSettings::BitSize(this->mSettings);
  RGBValue::ConvertTo8Bit(&rgb,bitSize,webColor);
  snprintf(webBuf,8,"#%02x%02x%02x",(ulong)webColor[0],(ulong)webColor[1],(ulong)webColor[2]);
  GenerateRGBStrings(this,&rgb,display_base,0x10,redString,greenString,blueString);
  snprintf(buf,0x100,"LED %d Red: %s Green: %s Blue: %s %s");
  AnalyzerResults::AddResultString((char *)this,buf,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
  ;
  snprintf(buf,0x100,"%d R: %s G: %s B: %s %s");
  AnalyzerResults::AddResultString((char *)this,buf,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
  ;
  snprintf(buf,0x100,"(%d) %s");
  AnalyzerResults::AddResultString((char *)this,buf,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
  ;
  AnalyzerResults::AddResultString
            ((char *)this,webBuf,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  Frame::~Frame(&frame);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    U32 ledIndex = frame.mData2;
    RGBValue rgb = RGBValue::CreateFromU64( frame.mData1 );

    // generate a Web/CSS representation of the color value
    U8 webColor[ 3 ];
    rgb.ConvertTo8Bit( mSettings->BitSize(), webColor );
    char webBuf[ 8 ];
    ::snprintf( webBuf, sizeof( webBuf ), "#%02x%02x%02x", webColor[ 0 ], webColor[ 1 ], webColor[ 2 ] );

    const int colorNumericBufferLength = 16;
    char redString[ colorNumericBufferLength ], greenString[ colorNumericBufferLength ], blueString[ colorNumericBufferLength ];

    GenerateRGBStrings( rgb, display_base, colorNumericBufferLength, redString, greenString, blueString );

    // generate four different string variants of varying length, starting with
    // the longest and decreasing in size
    char buf[ 256 ];

    // example: LED: 13 Red: 0x1A Green: 0x2B Blue: 0x3C #1A2B3C
    ::snprintf( buf, sizeof( buf ), "LED %d Red: %s Green: %s Blue: %s %s", ledIndex, redString, greenString, blueString, webBuf );
    AddResultString( buf );

    // example: 13 R:0x1A G:0x2B B:0x3C #1A2B3C
    ::snprintf( buf, sizeof( buf ), "%d R: %s G: %s B: %s %s", ledIndex, redString, greenString, blueString, webBuf );
    AddResultString( buf );

    // example: (13) #1A2B3C
    ::snprintf( buf, sizeof( buf ), "(%d) %s", ledIndex, webBuf );
    AddResultString( buf );

    // example: #1A2B3C
    AddResultString( webBuf );
}